

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_save_select_show_hash_option.hpp
# Opt level: O3

void __thiscall
PatchSaveSelectShowHashOption::alter_rom(PatchSaveSelectShowHashOption *this,ROM *rom)

{
  size_type sVar1;
  PatchSaveSelectShowHashOption *pPVar2;
  uint8_t i;
  long lVar3;
  long *plVar4;
  char *pcVar5;
  long *plVar6;
  char *pcVar7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ret_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ret;
  uchar local_99;
  long *local_98;
  size_type local_90;
  long local_88 [2];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  PatchSaveSelectShowHashOption *local_38;
  
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Hash","");
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(&local_58,local_90);
  if (local_90 != 0) {
    plVar4 = (long *)((long)local_98 + local_90);
    plVar6 = local_98;
    do {
      lVar3 = 0;
      do {
        if ((&Symbols::TABLE)[lVar3] == (char)*plVar6) {
          local_99 = (uchar)lVar3;
          std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_58,&local_99);
          break;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x6c);
      plVar6 = (long *)((long)plVar6 + 1);
    } while (plVar6 != plVar4);
  }
  md::ROM::set_bytes(rom,0x29a20,&local_58);
  pPVar2 = local_38;
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  md::ROM::set_word(rom,0x29a4b,0x100);
  md::ROM::set_word(rom,0x294e8,0xffff);
  md::ROM::set_byte(rom,0x29a4d,(uint8_t)(pPVar2->_hash_sentence)._M_string_length);
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (&local_78,(pPVar2->_hash_sentence)._M_string_length);
  sVar1 = (pPVar2->_hash_sentence)._M_string_length;
  if (sVar1 != 0) {
    pcVar7 = (pPVar2->_hash_sentence)._M_dataplus._M_p;
    pcVar5 = pcVar7 + sVar1;
    do {
      lVar3 = 0;
      do {
        if ((&Symbols::TABLE)[lVar3] == *pcVar7) {
          local_98 = (long *)CONCAT71(local_98._1_7_,(char)lVar3);
          std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_78,
                     (uchar *)&local_98);
          break;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x6c);
      pcVar7 = pcVar7 + 1;
    } while (pcVar7 != pcVar5);
  }
  md::ROM::set_bytes(rom,0x29a4e,&local_78);
  if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void alter_rom(md::ROM& rom)
    {
        // Replace "Copy" string by "Hash"
        rom.set_bytes(0x29A20, Symbols::bytes_for_symbols("Hash"));

        // Replace "Massan" by an empty string, and make this string the one shown for every map in the game
        rom.set_word(0x29A4B, 0x0100);
        rom.set_word(0x294E8, 0xFFFF);

        // Put hash sentence as string 4D
        rom.set_byte(0x29A4D, (uint8_t)_hash_sentence.size());
        rom.set_bytes(0x29A4E, Symbols::bytes_for_symbols(_hash_sentence));
    }